

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase355::run(TestCase355 *this)

{
  SourceLocation location;
  int iVar1;
  __pid_t _Var2;
  int local_144;
  DebugExpression<bool> _kjCondition;
  undefined3 uStack_13f;
  PromiseFulfillerPair<int> pair;
  __pid_t local_104;
  WaitScope waitScope;
  EventLoop loop;
  
  EventLoop::EventLoop(&loop);
  waitScope.busyPollInterval = 0xffffffff;
  waitScope.fiber.ptr = (FiberBase *)0x0;
  waitScope.runningStacksPool.ptr = (FiberPool *)0x0;
  waitScope.loop = &loop;
  EventLoop::enterScope(&loop);
  location._16_8_ = pair.fulfiller.ptr;
  location.fileName = (char *)pair.promise.super_PromiseBase.node.ptr;
  location.function = (char *)pair.fulfiller.disposer;
  newPromiseAndFulfiller<int>(location);
  iVar1 = (*((pair.fulfiller.ptr)->super_PromiseRejector)._vptr_PromiseRejector[1])();
  __kjCondition = CONCAT31(uStack_13f,(char)iVar1);
  if (kj::_::Debug::minSeverity < 3 && (char)iVar1 == '\0') {
    kj::_::Debug::log<char_const(&)[45],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x169,ERROR,"\"failed: expected \" \"pair.fulfiller->isWaiting()\", _kjCondition",
               (char (*) [45])"failed: expected pair.fulfiller->isWaiting()",&_kjCondition);
  }
  __kjCondition = 0x7b;
  (*((pair.fulfiller.ptr)->super_PromiseRejector)._vptr_PromiseRejector[2])();
  iVar1 = (*((pair.fulfiller.ptr)->super_PromiseRejector)._vptr_PromiseRejector[1])();
  __kjCondition = CONCAT31(uStack_13f,(byte)iVar1) ^ 1;
  if (((byte)iVar1 & kj::_::Debug::minSeverity < 3) != 0) {
    kj::_::Debug::log<char_const(&)[48],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x16b,ERROR,"\"failed: expected \" \"!(pair.fulfiller->isWaiting())\", _kjCondition"
               ,(char (*) [48])"failed: expected !(pair.fulfiller->isWaiting())",&_kjCondition);
  }
  _Var2 = Promise<int>::wait(&pair.promise,&waitScope);
  __kjCondition = 0x7b;
  if ((_Var2 != 0x7b) && (kj::_::Debug::minSeverity < 3)) {
    local_144 = 0x7b;
    local_104 = Promise<int>::wait(&pair.promise,&waitScope);
    kj::_::Debug::log<char_const(&)[57],kj::_::DebugComparison<int,int>&,int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x16d,ERROR,
               "\"failed: expected \" \"(123) == (pair.promise.wait(waitScope))\", _kjCondition, 123, pair.promise.wait(waitScope)"
               ,(char (*) [57])"failed: expected (123) == (pair.promise.wait(waitScope))",
               (DebugComparison<int,_int> *)&_kjCondition,&local_144,&local_104);
  }
  PromiseFulfillerPair<int>::~PromiseFulfillerPair(&pair);
  WaitScope::~WaitScope(&waitScope);
  EventLoop::~EventLoop(&loop);
  return;
}

Assistant:

TEST(Async, SeparateFulfiller) {
  EventLoop loop;
  WaitScope waitScope(loop);

  auto pair = newPromiseAndFulfiller<int>();

  EXPECT_TRUE(pair.fulfiller->isWaiting());
  pair.fulfiller->fulfill(123);
  EXPECT_FALSE(pair.fulfiller->isWaiting());

  EXPECT_EQ(123, pair.promise.wait(waitScope));
}